

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_bbox.cpp
# Opt level: O0

BBox<2> * Omega_h::find_bounding_box<2>(BBox<2> *__return_storage_ptr__,Reals *coords)

{
  undefined8 in_R8;
  undefined8 in_R9;
  Read<double> local_f0;
  GetBBoxOp<2> local_e0;
  undefined8 local_c8;
  double dStack_c0;
  double local_b8;
  double dStack_b0;
  int local_a4;
  undefined8 local_a0;
  undefined8 uStack_98;
  Int i;
  BBox<2> init;
  int npts;
  Reals *coords_local;
  ulong local_10;
  
  if (((ulong)(coords->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = ((coords->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (ulong)(coords->write_).shared_alloc_.alloc >> 3;
  }
  local_a4 = divide_no_remainder<int>((int)(local_10 >> 3),2);
  for (local_a0._4_4_ = 0; local_a0._4_4_ < 2; local_a0._4_4_ = local_a0._4_4_ + 1) {
    init.min.super_Few<double,_2>.array_[(long)local_a0._4_4_ + -1] = 1.79769313486232e+308;
    init.min.super_Few<double,_2>.array_[(long)local_a0._4_4_ + 1] = -1.79769313486232e+308;
  }
  local_a0._0_4_ = (Omega_h *)0x0;
  local_b8 = init.min.super_Few<double,_2>.array_[1];
  dStack_b0 = init.max.super_Few<double,_2>.array_[0];
  local_c8 = uStack_98;
  dStack_c0 = init.min.super_Few<double,_2>.array_[0];
  init.max.super_Few<double,_2>.array_[1]._4_4_ = local_a4;
  Read<double>::Read(&local_f0,coords);
  GetBBoxOp<2>::GetBBoxOp(&local_e0,&local_f0);
  transform_reduce<Omega_h::IntIterator,Omega_h::GetBBoxOp<2>,Omega_h::BBox<2>,Omega_h::UniteOp<2>>
            (__return_storage_ptr__,(Omega_h *)local_a0,local_a4,&local_e0,in_R8,in_R9,
             (undefined4)local_c8,dStack_c0._0_4_,local_b8._0_4_,dStack_b0._0_4_);
  GetBBoxOp<2>::~GetBBoxOp(&local_e0);
  Read<double>::~Read(&local_f0);
  return __return_storage_ptr__;
}

Assistant:

BBox<dim> find_bounding_box(Reals coords) {
  auto npts = divide_no_remainder(coords.size(), dim);
  BBox<dim> init;
  for (Int i = 0; i < dim; ++i) {
    init.min[i] = ArithTraits<Real>::max();
    init.max[i] = ArithTraits<Real>::min();
  }
  return transform_reduce(IntIterator(0), IntIterator(npts), init,
      UniteOp<dim>(), GetBBoxOp<dim>(coords));
}